

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_pushlstring(lua_State *L,char *str,size_t len)

{
  undefined4 *puVar1;
  GCstr *pGVar2;
  ulong uVar3;
  long in_RDI;
  GCstr *s;
  lua_State *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  lua_State *in_stack_ffffffffffffffd8;
  
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x24) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x20)) {
    lj_gc_step(in_stack_ffffffffffffffa8);
  }
  pGVar2 = lj_str_new(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
  ;
  puVar1 = *(undefined4 **)(in_RDI + 0x18);
  *puVar1 = (int)pGVar2;
  puVar1[1] = 0xfffffffb;
  uVar3 = *(long *)(in_RDI + 0x18) + 8;
  *(ulong *)(in_RDI + 0x18) = uVar3;
  if (*(uint *)(in_RDI + 0x20) <= uVar3) {
    lj_state_growstack1((lua_State *)0x112432);
  }
  return;
}

Assistant:

LUA_API void lua_pushlstring(lua_State *L, const char *str, size_t len)
{
  GCstr *s;
  lj_gc_check(L);
  s = lj_str_new(L, str, len);
  setstrV(L, L->top, s);
  incr_top(L);
}